

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AppendToList
          (ExtensionSet *this,Descriptor *containing_type,DescriptorPool *pool,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  ushort uVar1;
  int number;
  KeyValue *pKVar2;
  anon_class_24_3_67308ef9 func;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *this_00;
  byte bVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  KeyValue *pKVar6;
  FieldDescriptor **__args;
  iterator __position;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *local_68;
  anon_class_24_3_67308ef9 local_60;
  Descriptor *local_48;
  DescriptorPool *pDStack_40;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  **local_38;
  
  local_38 = &local_68;
  pKVar2 = (this->map_).flat;
  local_68 = (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)output;
  local_48 = containing_type;
  pDStack_40 = pool;
  if (this->flat_capacity_ < 0x101) {
    uVar1 = this->flat_size_;
    if (uVar1 != 0) {
      __args = &(pKVar2->second).descriptor;
      do {
        number = *(int *)(__args + -3);
        if (*(bool *)((long)__args + -7) == true) {
          iVar4 = Extension::GetSize((Extension *)(__args + -2));
          bVar3 = 0 < iVar4;
        }
        else {
          bVar3 = *(byte *)((long)__args + -6) ^ 1;
        }
        this_00 = local_68;
        if ((bVar3 & 1) != 0) {
          pFVar5 = *__args;
          if (pFVar5 == (FieldDescriptor *)0x0) {
            pFVar5 = DescriptorPool::FindExtensionByNumber(pool,containing_type,number);
            __position._M_current = *(FieldDescriptor ***)(this_00 + 8);
            local_60.containing_type = (Descriptor *)pFVar5;
            if (__position._M_current != *(FieldDescriptor ***)(this_00 + 0x10)) goto LAB_00358a6e;
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                      (this_00,__position,(FieldDescriptor **)&local_60);
          }
          else {
            __position._M_current = *(FieldDescriptor ***)(local_68 + 8);
            if (__position._M_current == *(FieldDescriptor ***)(local_68 + 0x10)) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        (local_68,__position,__args);
            }
            else {
LAB_00358a6e:
              *__position._M_current = pFVar5;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
        }
        pKVar6 = (KeyValue *)(__args + 1);
        __args = __args + 4;
      } while (pKVar6 != pKVar2 + uVar1);
    }
  }
  else {
    func.pool = pool;
    func.containing_type = containing_type;
    func.output = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   **)local_38;
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::AppendToList(google::protobuf::Descriptor_const*,google::protobuf::DescriptorPool_const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*)const::__0>
              (&local_60,(ExtensionSet *)(pKVar2->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar2->second,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )output,func);
  }
  return;
}

Assistant:

void ExtensionSet::AppendToList(
    const Descriptor* containing_type, const DescriptorPool* pool,
    std::vector<const FieldDescriptor*>* output) const {
  ForEach([containing_type, pool, &output](int number, const Extension& ext) {
    bool has = false;
    if (ext.is_repeated) {
      has = ext.GetSize() > 0;
    } else {
      has = !ext.is_cleared;
    }

    if (has) {
      // TODO(kenton): Looking up each field by number is somewhat unfortunate.
      //   Is there a better way?  The problem is that descriptors are lazily-
      //   initialized, so they might not even be constructed until
      //   AppendToList() is called.

      if (ext.descriptor == NULL) {
        output->push_back(pool->FindExtensionByNumber(containing_type, number));
      } else {
        output->push_back(ext.descriptor);
      }
    }
  });
}